

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O2

node * remhead(list *l)

{
  node *pnVar1;
  node *pnVar2;
  
  pnVar1 = l->first;
  pnVar2 = pnVar1->next;
  if (pnVar2 != (node *)0x0) {
    l->first = pnVar2;
    pnVar2->pred = pnVar1->pred;
    return pnVar1;
  }
  return (node *)0x0;
}

Assistant:

struct node *remhead(struct list *l)
/* remove first node in list and return a pointer to it */
{
  struct node *n = l->first;

  if (n->next) {
    l->first = n->next;
    n->next->pred = n->pred;
    return n;
  }
  return NULL;
}